

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O2

qpdf_offset_t __thiscall
QPDFWriter::writeXRefTable
          (QPDFWriter *this,trailer_e which,int first,int last,int size,qpdf_offset_t prev,
          bool suppress_offsets,int hint_id,qpdf_offset_t hint_offset,qpdf_offset_t hint_length,
          int linearization_pass)

{
  Count *pCVar1;
  size_type *psVar2;
  NewObject *this_00;
  qpdf_offset_t qVar3;
  string *psVar4;
  char *pcVar5;
  long lVar6;
  QUtil *this_01;
  int i;
  string_view str;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  string_view str_03;
  string_view str_04;
  string_view str_05;
  string_view str_06;
  string local_60;
  size_type local_40;
  qpdf_offset_t local_38;
  size_t sVar7;
  
  str._M_str = "xref\n";
  str._M_len = 5;
  writeString(this,str);
  std::__cxx11::to_string(&local_60,first);
  str_00._M_str = local_60._M_dataplus._M_p;
  str_00._M_len = local_60._M_string_length;
  writeString(this,str_00);
  local_38 = prev;
  std::__cxx11::string::~string((string *)&local_60);
  str_01._M_str = " ";
  str_01._M_len = 1;
  writeString(this,str_01);
  std::__cxx11::to_string(&local_60,(last - first) + 1);
  str_02._M_str = local_60._M_dataplus._M_p;
  str_02._M_len = local_60._M_string_length;
  writeString(this,str_02);
  std::__cxx11::string::~string((string *)&local_60);
  pCVar1 = ((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           pipeline;
  psVar4 = pCVar1->str;
  psVar2 = (size_type *)&pCVar1->count;
  if (psVar4 != (string *)0x0) {
    psVar2 = &psVar4->_M_string_length;
  }
  local_40 = *psVar2;
  str_03._M_str = "\n";
  str_03._M_len = 1;
  writeString(this,str_03);
  for (; first <= last; first = first + 1) {
    if (first == 0) {
      sVar7 = 0x14;
      pcVar5 = "0000000000 65535 f \n";
    }
    else {
      if (suppress_offsets) {
        this_01 = (QUtil *)0x0;
      }
      else {
        this_00 = ObjTable<QPDFWriter::NewObject>::operator[]
                            (&(((this->m).
                                super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr)->new_obj).super_ObjTable<QPDFWriter::NewObject>,first);
        qVar3 = QPDFXRefEntry::getOffset(&this_00->xref);
        lVar6 = 0;
        if (hint_offset <= qVar3) {
          lVar6 = hint_length;
        }
        psVar4 = (string *)(ulong)(uint)hint_id;
        if (hint_id == first) {
          lVar6 = 0;
        }
        if (hint_id == 0) {
          lVar6 = 0;
        }
        this_01 = (QUtil *)(lVar6 + qVar3);
      }
      QUtil::int_to_string_abi_cxx11_(&local_60,this_01,10,(int)psVar4);
      str_04._M_str = local_60._M_dataplus._M_p;
      str_04._M_len = local_60._M_string_length;
      writeString(this,str_04);
      std::__cxx11::string::~string((string *)&local_60);
      pcVar5 = " 00000 n \n";
      sVar7 = 10;
    }
    str_05._M_str = pcVar5;
    str_05._M_len = sVar7;
    writeString(this,str_05);
  }
  writeTrailer(this,which,size,false,local_38,linearization_pass);
  str_06._M_str = "\n";
  str_06._M_len = 1;
  writeString(this,str_06);
  return local_40;
}

Assistant:

qpdf_offset_t
QPDFWriter::writeXRefTable(
    trailer_e which,
    int first,
    int last,
    int size,
    qpdf_offset_t prev,
    bool suppress_offsets,
    int hint_id,
    qpdf_offset_t hint_offset,
    qpdf_offset_t hint_length,
    int linearization_pass)
{
    writeString("xref\n");
    writeString(std::to_string(first));
    writeString(" ");
    writeString(std::to_string(last - first + 1));
    qpdf_offset_t space_before_zero = m->pipeline->getCount();
    writeString("\n");
    for (int i = first; i <= last; ++i) {
        if (i == 0) {
            writeString("0000000000 65535 f \n");
        } else {
            qpdf_offset_t offset = 0;
            if (!suppress_offsets) {
                offset = m->new_obj[i].xref.getOffset();
                if ((hint_id != 0) && (i != hint_id) && (offset >= hint_offset)) {
                    offset += hint_length;
                }
            }
            writeString(QUtil::int_to_string(offset, 10));
            writeString(" 00000 n \n");
        }
    }
    writeTrailer(which, size, false, prev, linearization_pass);
    writeString("\n");
    return space_before_zero;
}